

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_d.cpp
# Opt level: O2

int idamax(int n,double *dx,int incx)

{
  int iVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  int iVar7;
  double dVar8;
  
  iVar3 = 0;
  if (0 < incx && 0 < n) {
    if (n == 1) {
      return 1;
    }
    dVar8 = ABS(*dx);
    if (incx != 1) {
      pdVar6 = dx + (uint)incx;
      iVar3 = 1;
      for (iVar7 = 2; iVar7 - n != 1; iVar7 = iVar7 + 1) {
        dVar2 = ABS(*pdVar6);
        iVar1 = iVar7;
        if (ABS(*pdVar6) <= dVar8) {
          dVar2 = dVar8;
          iVar1 = iVar3;
        }
        dVar8 = dVar2;
        pdVar6 = pdVar6 + (uint)incx;
        iVar3 = iVar1;
      }
      return iVar3;
    }
    uVar4 = 1;
    uVar5 = 1;
    while (iVar3 = (int)uVar4, (uint)n != uVar5) {
      pdVar6 = dx + uVar5;
      uVar5 = uVar5 + 1;
      if (dVar8 < ABS(*pdVar6)) {
        uVar4 = uVar5 & 0xffffffff;
        dVar8 = ABS(*pdVar6);
      }
    }
  }
  return iVar3;
}

Assistant:

int idamax ( int n, double dx[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    IDAMAX finds the index of the vector element of maximum absolute value.
//
//  Discussion:
//
//    WARNING: This index is a 1-based index, not a 0-based index!
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 May 2005
//
//  Author:
//
//    Original FORTRAN77 version by Charles Lawson, Richard Hanson, 
//    David Kincaid, Fred Krogh.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double X[*], the vector to be examined.
//
//    Input, int INCX, the increment between successive entries of SX.
//
//    Output, int IDAMAX, the index of the element of maximum
//    absolute value.
//
{
  double dmax;
  int i;
  int ix;
  int value;

  value = 0;

  if ( n < 1 || incx <= 0 )
  {
    return value;
  }

  value = 1;

  if ( n == 1 )
  {
    return value;
  }

  if ( incx == 1 )
  {
    dmax = fabs ( dx[0] );

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[i] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[i] );
      }
    }
  }
  else
  {
    ix = 0;
    dmax = fabs ( dx[0] );
    ix = ix + incx;

    for ( i = 1; i < n; i++ )
    {
      if ( dmax < fabs ( dx[ix] ) )
      {
        value = i + 1;
        dmax = fabs ( dx[ix] );
      }
      ix = ix + incx;
    }
  }

  return value;
}